

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi_file_states.hpp
# Opt level: O3

void __thiscall
duckdb::MultiFileGlobalState::MultiFileGlobalState
          (MultiFileGlobalState *this,
          unique_ptr<duckdb::MultiFileList,_std::default_delete<duckdb::MultiFileList>,_true>
          *owned_file_list_p)

{
  type pMVar1;
  
  (this->super_GlobalTableFunctionState)._vptr_GlobalTableFunctionState =
       (_func_int **)&PTR__MultiFileGlobalState_02445bf0;
  pMVar1 = unique_ptr<duckdb::MultiFileList,_std::default_delete<duckdb::MultiFileList>,_true>::
           operator*(owned_file_list_p);
  this->file_list = pMVar1;
  (this->file_list_scan).current_file_idx = 0xffffffffffffffff;
  (this->owned_file_list).
  super_unique_ptr<duckdb::MultiFileList,_std::default_delete<duckdb::MultiFileList>_>._M_t.
  super___uniq_ptr_impl<duckdb::MultiFileList,_std::default_delete<duckdb::MultiFileList>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::MultiFileList_*,_std::default_delete<duckdb::MultiFileList>_>.
  super__Head_base<0UL,_duckdb::MultiFileList_*,_false>._M_head_impl =
       (owned_file_list_p->
       super_unique_ptr<duckdb::MultiFileList,_std::default_delete<duckdb::MultiFileList>_>)._M_t.
       super___uniq_ptr_impl<duckdb::MultiFileList,_std::default_delete<duckdb::MultiFileList>_>.
       _M_t.
       super__Tuple_impl<0UL,_duckdb::MultiFileList_*,_std::default_delete<duckdb::MultiFileList>_>.
       super__Head_base<0UL,_duckdb::MultiFileList_*,_false>._M_head_impl;
  (owned_file_list_p->
  super_unique_ptr<duckdb::MultiFileList,_std::default_delete<duckdb::MultiFileList>_>)._M_t.
  super___uniq_ptr_impl<duckdb::MultiFileList,_std::default_delete<duckdb::MultiFileList>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::MultiFileList_*,_std::default_delete<duckdb::MultiFileList>_>.
  super__Head_base<0UL,_duckdb::MultiFileList_*,_false>._M_head_impl = (MultiFileList *)0x0;
  (this->lock).super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  (this->lock).super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
  *(undefined8 *)((long)&(this->lock).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->lock).super___mutex_base._M_mutex + 0x10) = 0;
  (this->multi_file_reader_state).
  super_unique_ptr<duckdb::MultiFileReaderGlobalState,_std::default_delete<duckdb::MultiFileReaderGlobalState>_>
  ._M_t.
  super___uniq_ptr_impl<duckdb::MultiFileReaderGlobalState,_std::default_delete<duckdb::MultiFileReaderGlobalState>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::MultiFileReaderGlobalState_*,_std::default_delete<duckdb::MultiFileReaderGlobalState>_>
  .super__Head_base<0UL,_duckdb::MultiFileReaderGlobalState_*,_false>._M_head_impl =
       (MultiFileReaderGlobalState *)0x0;
  (this->lock).super___mutex_base._M_mutex.__align = 0;
  this->error_opening_file = false;
  this->completed_file_index = 0;
  (this->readers).
  super_vector<duckdb::unique_ptr<duckdb::MultiFileReaderData,_std::default_delete<duckdb::MultiFileReaderData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::MultiFileReaderData,_std::default_delete<duckdb::MultiFileReaderData>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::MultiFileReaderData,_std::default_delete<duckdb::MultiFileReaderData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::MultiFileReaderData,_std::default_delete<duckdb::MultiFileReaderData>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->readers).
  super_vector<duckdb::unique_ptr<duckdb::MultiFileReaderData,_std::default_delete<duckdb::MultiFileReaderData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::MultiFileReaderData,_std::default_delete<duckdb::MultiFileReaderData>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::MultiFileReaderData,_std::default_delete<duckdb::MultiFileReaderData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::MultiFileReaderData,_std::default_delete<duckdb::MultiFileReaderData>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->readers).
  super_vector<duckdb::unique_ptr<duckdb::MultiFileReaderData,_std::default_delete<duckdb::MultiFileReaderData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::MultiFileReaderData,_std::default_delete<duckdb::MultiFileReaderData>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::MultiFileReaderData,_std::default_delete<duckdb::MultiFileReaderData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::MultiFileReaderData,_std::default_delete<duckdb::MultiFileReaderData>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->batch_index = 0;
  this->max_threads = 1;
  (this->projection_ids).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->projection_ids).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->projection_ids).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->scanned_types).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->scanned_types).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->scanned_types).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->column_indexes).super_vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>.
  super__Vector_base<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->column_indexes).super_vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>.
  super__Vector_base<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->column_indexes).super_vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>.
  super__Vector_base<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->filters).ptr = (TableFilterSet *)0x0;
  (this->global_state).
  super_unique_ptr<duckdb::GlobalTableFunctionState,_std::default_delete<duckdb::GlobalTableFunctionState>_>
  ._M_t.
  super___uniq_ptr_impl<duckdb::GlobalTableFunctionState,_std::default_delete<duckdb::GlobalTableFunctionState>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::GlobalTableFunctionState_*,_std::default_delete<duckdb::GlobalTableFunctionState>_>
  .super__Head_base<0UL,_duckdb::GlobalTableFunctionState_*,_false>._M_head_impl =
       (GlobalTableFunctionState *)0x0;
  return;
}

Assistant:

explicit MultiFileGlobalState(unique_ptr<MultiFileList> owned_file_list_p)
	    : file_list(*owned_file_list_p), owned_file_list(std::move(owned_file_list_p)) {
	}